

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCTest.cpp
# Opt level: O0

Function * RandomFunction(void)

{
  bool bVar1;
  int iVar2;
  int i_2;
  int const_str;
  int i_1;
  int const_num;
  Instruction instruction;
  OpType op;
  uint op_max;
  uint op_min;
  int i;
  int instruction_count;
  String *s;
  Function *f;
  GC *in_stack_ffffffffffffff98;
  GC *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  OpType in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  Instruction in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffb8;
  GC *this;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  int local_34;
  Instruction local_28;
  OpType local_24;
  undefined4 local_20;
  undefined4 local_1c;
  int local_18;
  int local_14;
  String *local_10;
  GC *local_8;
  
  local_8 = (GC *)luna::GC::NewFunction
                            ((GC *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             (GCGeneration)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  local_10 = RandomString();
  luna::Function::SetModuleName((Function *)local_8,local_10);
  this = local_8;
  iVar2 = RandomNum<int>(0x124cc7);
  luna::Function::SetLine((Function *)this,iVar2);
  local_14 = RandomRange<int>(0,0x124ce2);
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    local_1c = 1;
    local_20 = 9;
    in_stack_ffffffffffffffac = RandomRange<unsigned_int>(0,0x124d19);
    local_24 = in_stack_ffffffffffffffac;
    in_stack_ffffffffffffffb0 = RandomNum<int>(0x124d2f);
    in_stack_ffffffffffffffb4.opcode_ = RandomNum<int>(0x124d3d);
    iVar2 = RandomNum<int>(0x124d4b);
    luna::Instruction::Instruction
              (&local_28,in_stack_ffffffffffffffac,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffb4.opcode_,iVar2);
    luna::Function::AddInstruction
              ((Function *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
               in_stack_ffffffffffffffb4,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  }
  iVar2 = RandomNum<int>(0x124d98);
  for (local_34 = 0; local_34 < iVar2; local_34 = local_34 + 1) {
    in_stack_ffffffffffffffa0 = local_8;
    RandomNum<int>(0x124dc2);
    luna::Function::AddConstNumber
              ((Function *)CONCAT44(in_stack_ffffffffffffffb4.opcode_,in_stack_ffffffffffffffb0),
               (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  iVar2 = RandomNum<int>(0x124de7);
  for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
    in_stack_ffffffffffffff98 = local_8;
    RandomString();
    luna::Function::AddConstString
              ((Function *)CONCAT44(in_stack_ffffffffffffffb4.opcode_,in_stack_ffffffffffffffb0),
               (String *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  bVar1 = luna::CheckBarrier((GCObject *)local_8);
  if (bVar1) {
    luna::GC::SetBarrier(in_stack_ffffffffffffffa0,(GCObject *)in_stack_ffffffffffffff98);
  }
  return (Function *)local_8;
}

Assistant:

luna::Function * RandomFunction()
{
    auto f = g_gc.NewFunction();

    auto s = RandomString();
    f->SetModuleName(s);
    f->SetLine(RandomNum(1000));

    int instruction_count = RandomRange(10, 1000);
    for (int i = 0; i < instruction_count; ++i)
    {
        unsigned int op_min = luna::OpType_LoadNil;
        unsigned int op_max = luna::OpType_GetGlobal;
        luna::OpType op = static_cast<luna::OpType>(RandomRange(op_min, op_max));
        luna::Instruction instruction(op, RandomNum(128), RandomNum(128), RandomNum(128));
        f->AddInstruction(instruction, i);
    }

    int const_num = RandomNum(5);
    for (int i = 0; i < const_num; ++i)
        f->AddConstNumber(RandomNum(100000));

    int const_str = RandomNum(5);
    for (int i = 0; i < const_str; ++i)
        f->AddConstString(RandomString());

    CHECK_BARRIER(g_gc, f);

    return f;
}